

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_grammar.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::AssemblyGrammar::lookupSpecConstantOpcode(AssemblyGrammar *this,char *name,Op *opcode)

{
  bool bVar1;
  spv_result_t sVar2;
  long lVar3;
  SpecConstantOpcodeEntry *__it;
  char *local_30;
  
  lVar3 = 0;
  local_30 = name;
  do {
    if (lVar3 == 0x3c0) {
      __it = (SpecConstantOpcodeEntry *)&DAT_003b6a30;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<spvtools::AssemblyGrammar::lookupSpecConstantOpcode(char_const*,spv::Op*)const::$_0>
              ::operator()((_Iter_pred<spvtools::AssemblyGrammar::lookupSpecConstantOpcode(char_const*,spv::Op*)const::__0>
                            *)&local_30,(SpecConstantOpcodeEntry *)&DAT_003b6a30);
      if (bVar1) {
LAB_00246652:
        *opcode = __it->opcode;
        sVar2 = SPV_SUCCESS;
      }
      else {
LAB_0024663d:
        sVar2 = SPV_ERROR_INVALID_LOOKUP;
      }
      return sVar2;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::AssemblyGrammar::lookupSpecConstantOpcode(char_const*,spv::Op*)const::$_0>
            ::operator()((_Iter_pred<spvtools::AssemblyGrammar::lookupSpecConstantOpcode(char_const*,spv::Op*)const::__0>
                          *)&local_30,
                         (SpecConstantOpcodeEntry *)
                         ((long)&(anonymous_namespace)::kOpSpecConstantOpcodes + lVar3));
    if (bVar1) goto LAB_0024664c;
    __it = (SpecConstantOpcodeEntry *)((long)&DAT_003b6680 + lVar3);
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::AssemblyGrammar::lookupSpecConstantOpcode(char_const*,spv::Op*)const::$_0>
            ::operator()((_Iter_pred<spvtools::AssemblyGrammar::lookupSpecConstantOpcode(char_const*,spv::Op*)const::__0>
                          *)&local_30,__it);
    if (bVar1) {
      if (lVar3 != 0x3c0) goto LAB_00246652;
      goto LAB_0024663d;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::AssemblyGrammar::lookupSpecConstantOpcode(char_const*,spv::Op*)const::$_0>
            ::operator()((_Iter_pred<spvtools::AssemblyGrammar::lookupSpecConstantOpcode(char_const*,spv::Op*)const::__0>
                          *)&local_30,(SpecConstantOpcodeEntry *)((long)&DAT_003b6690 + lVar3));
    if (bVar1) {
      lVar3 = lVar3 + 0x20;
LAB_0024664c:
      __it = (SpecConstantOpcodeEntry *)
             ((long)&(anonymous_namespace)::kOpSpecConstantOpcodes + lVar3);
      goto LAB_00246652;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::AssemblyGrammar::lookupSpecConstantOpcode(char_const*,spv::Op*)const::$_0>
            ::operator()((_Iter_pred<spvtools::AssemblyGrammar::lookupSpecConstantOpcode(char_const*,spv::Op*)const::__0>
                          *)&local_30,(SpecConstantOpcodeEntry *)((long)&DAT_003b66a0 + lVar3));
    if (bVar1) {
      lVar3 = lVar3 + 0x30;
      goto LAB_0024664c;
    }
    lVar3 = lVar3 + 0x40;
  } while( true );
}

Assistant:

spv_result_t AssemblyGrammar::lookupSpecConstantOpcode(const char* name,
                                                       spv::Op* opcode) const {
  const auto* last = kOpSpecConstantOpcodes + kNumOpSpecConstantOpcodes;
  const auto* found =
      std::find_if(kOpSpecConstantOpcodes, last,
                   [name](const SpecConstantOpcodeEntry& entry) {
                     return 0 == strcmp(name, entry.name);
                   });
  if (found == last) return SPV_ERROR_INVALID_LOOKUP;
  *opcode = found->opcode;
  return SPV_SUCCESS;
}